

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O1

void __thiscall tcmalloc::PageHeap::RemoveFromFreeList(PageHeap *this,Span *span)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  ulong uVar3;
  Span *pSVar4;
  bool bVar5;
  SpanSet *this_00;
  pair<std::_Rb_tree_iterator<tcmalloc::Span_*>,_std::_Rb_tree_iterator<tcmalloc::Span_*>_> pVar6;
  Span *local_18;
  
  uVar2 = span->location;
  local_18 = span;
  if (uVar2 == 0) {
    __assert_fail("span->location != Span::IN_USE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                  ,0x185,"void tcmalloc::PageHeap::RemoveFromFreeList(Span *)");
  }
  uVar3 = span->npages;
  if (uVar3 < 0x80) {
    if (uVar2 == 1) {
      this->small_normal_size_[uVar3] = this->small_normal_size_[uVar3] - 1;
      puVar1 = &(this->stat).small_normal_bytes;
      *puVar1 = *puVar1 + span->npages * -0x2000;
    }
    else {
      this->small_returned_size_[uVar3] = this->small_returned_size_[uVar3] - 1;
      puVar1 = &(this->stat).small_returned_bytes;
      *puVar1 = *puVar1 + span->npages * -0x2000;
    }
    pSVar4 = span->prev;
    pSVar4->next = span->next;
    span->next->prev = pSVar4;
    span->prev = (Span *)0x0;
    span->next = (Span *)0x0;
  }
  else {
    if (uVar2 == 1) {
      puVar1 = &(this->stat).large_normal_bytes;
      *puVar1 = *puVar1 + uVar3 * -0x2000;
      this_00 = &this->large_normal_;
    }
    else {
      puVar1 = &(this->stat).large_returned_bytes;
      *puVar1 = *puVar1 + uVar3 * -0x2000;
      this_00 = &this->large_returned_;
    }
    pVar6 = std::
            _Rb_tree<tcmalloc::Span_*,_tcmalloc::Span_*,_std::_Identity<tcmalloc::Span_*>,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
            ::equal_range(&this_00->_M_t,&local_18);
    std::
    _Rb_tree<tcmalloc::Span_*,_tcmalloc::Span_*,_std::_Identity<tcmalloc::Span_*>,_tcmalloc::SpanLessCompare,_tcmalloc::STLFixedAllocator<tcmalloc::Span_*,_0>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node);
  }
  puVar1 = &(this->stat).normal_bytes + (local_18->location != 1);
  *puVar1 = *puVar1 + local_18->npages * -0x2000;
  bVar5 = CheckSmallList(this);
  if (bVar5) {
    return;
  }
  __assert_fail("CheckSmallList()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/page_heap.hpp"
                ,0x1a0,"void tcmalloc::PageHeap::RemoveFromFreeList(Span *)");
}

Assistant:

void RemoveFromFreeList(Span* span) {
        assert(span->location != Span::IN_USE);
        if (span->npages <= spanSmallPages) {
            if (span->location == Span::IN_NORMAL) {
                small_normal_size_[span->npages]--;
                stat.small_normal_bytes -= span->npages * spanPageSize;
                ListRemove(span);
            } else {
                small_returned_size_[span->npages]--;
                stat.small_returned_bytes -= span->npages * spanPageSize;
                ListRemove(span);
            }
        } else {
            if (span->location == Span::IN_NORMAL) {
                stat.large_normal_bytes -= span->npages * spanPageSize;
                large_normal_.erase(span);
            } else {
                stat.large_returned_bytes -= span->npages * spanPageSize;
                large_returned_.erase(span);
            }
        }

        if (span->location == Span::IN_NORMAL) {
            stat.normal_bytes -= span->npages * spanPageSize;
        } else {
            stat.returned_bytes -= span->npages * spanPageSize;
        }

        assert(CheckSmallList());
    }